

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O0

void __thiscall QtMWidgets::TextLabel::resizeEvent(TextLabel *this,QResizeEvent *e)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QSize *this_00;
  TextLabelPrivate *pTVar5;
  socklen_t *__addr_len;
  sockaddr *__addr;
  int __fd;
  undefined1 auVar6 [16];
  undefined1 local_28 [8];
  QMargins margins;
  QResizeEvent *e_local;
  TextLabel *this_local;
  
  __fd = (int)e;
  margins._8_8_ = e;
  auVar6 = QWidget::contentsMargins();
  margins._0_8_ = auVar6._8_8_;
  local_28 = auVar6._0_8_;
  QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
  ::operator->(&this->d);
  this_00 = QResizeEvent::size((QResizeEvent *)margins._8_8_);
  iVar1 = QSize::width(this_00);
  iVar2 = QFrame::frameWidth();
  iVar3 = QMargins::left((QMargins *)local_28);
  iVar4 = QMargins::right((QMargins *)local_28);
  pTVar5 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
           ::operator->(&this->d);
  __addr_len = (socklen_t *)(ulong)(uint)(pTVar5->margin * 2);
  QStaticText::setTextWidth
            ((double)((((iVar1 + iVar2 * -2) - iVar3) - iVar4) + pTVar5->margin * -2));
  QEvent::accept((QEvent *)margins._8_8_,__fd,__addr,__addr_len);
  return;
}

Assistant:

void
TextLabel::resizeEvent( QResizeEvent * e )
{
	const QMargins margins = contentsMargins();

	d->staticText.setTextWidth( e->size().width() - 2 * frameWidth() -
		margins.left() - margins.right() - 2 * d->margin );

	e->accept();
}